

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredRendering.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GeometryShaderLayeredRendering::iterate(GeometryShaderLayeredRendering *this)

{
  _layered_rendering_test *p_Var1;
  _layered_rendering_test *p_Var2;
  long lVar3;
  bool bVar4;
  int iVar5;
  GLuint GVar6;
  deUint32 dVar7;
  undefined4 uVar8;
  undefined4 extraout_var;
  MessageBuilder *pMVar9;
  TestError *this_00;
  long lVar10;
  char *description;
  _layered_rendering_test *p_Var11;
  long lVar12;
  qpTestResult testResult;
  pointer_____offset_0x10___ *ppuVar13;
  TestContext *this_01;
  long lVar14;
  ulong uVar15;
  long lVar16;
  GeometryShaderLayeredRendering *pGVar17;
  long lVar18;
  undefined8 uVar19;
  GLuint dst_fbo_id;
  _layered_rendering_test *local_12b0;
  GeometryShaderLayeredRendering *local_12a8;
  _layered_rendering_test *local_12a0;
  _layered_rendering_test *local_1298;
  long local_1290;
  _layered_rendering_test *local_1288;
  char *twodimensionalma_vs_parts [1];
  char *twodimensionalma_fs_parts [1];
  char *twodimensionala_vs_parts [1];
  char *twodimensionala_fs_parts [1];
  char *threedimensional_vs_parts [1];
  char *threedimensional_fs_parts [1];
  char *cm_vs_parts [1];
  char *cm_fs_parts [1];
  GLint layer_provoking_vertex_gl_value;
  char *twodimensionalma_gs_parts [3];
  char *twodimensionala_gs_parts [3];
  char *threedimensional_gs_parts [3];
  char *cm_gs_parts [3];
  GLuint new_dst_to;
  ostringstream local_11b0 [376];
  uchar buffer [4096];
  
  iVar5 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar5);
  cm_fs_parts[0] = m_layered_rendering_fs_code;
  cm_gs_parts[0] = m_layered_rendering_gs_code_preamble;
  cm_gs_parts[1] = m_layered_rendering_gs_code_cm;
  cm_gs_parts[2] = m_layered_rendering_gs_code_main;
  cm_vs_parts[0] = m_layered_rendering_vs_code;
  threedimensional_fs_parts[0] = m_layered_rendering_fs_code;
  threedimensional_gs_parts[0] = m_layered_rendering_gs_code_preamble;
  threedimensional_gs_parts[1] = m_layered_rendering_gs_code_3d;
  threedimensional_gs_parts[2] = m_layered_rendering_gs_code_main;
  threedimensional_vs_parts[0] = m_layered_rendering_vs_code;
  twodimensionala_fs_parts[0] = m_layered_rendering_fs_code;
  twodimensionala_gs_parts[0] = m_layered_rendering_gs_code_preamble;
  twodimensionala_gs_parts[1] = m_layered_rendering_gs_code_2d_array;
  twodimensionala_gs_parts[2] = m_layered_rendering_gs_code_main;
  twodimensionala_vs_parts[0] = m_layered_rendering_vs_code;
  twodimensionalma_fs_parts[0] = m_layered_rendering_fs_code;
  twodimensionalma_gs_parts[0] = m_layered_rendering_gs_code_preamble;
  twodimensionalma_gs_parts[1] = m_layered_rendering_gs_code_2d_marray;
  twodimensionalma_gs_parts[2] = m_layered_rendering_gs_code_main;
  twodimensionalma_vs_parts[0] = m_layered_rendering_vs_code;
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
               ,0xfc);
    ppuVar13 = &tcu::NotSupportedError::typeinfo;
    goto LAB_00ce26a1;
  }
  p_Var11 = this->m_tests + 3;
  this->m_tests[3].n_layers = 6;
  this->m_tests[3].fs_parts = cm_fs_parts;
  this->m_tests[3].gs_parts = cm_gs_parts;
  this->m_tests[3].vs_parts = cm_vs_parts;
  this->m_tests[3].n_fs_parts = 1;
  this->m_tests[3].n_gs_parts = 3;
  this->m_tests[3].n_vs_parts = 1;
  this->m_tests[3].iteration = LAYERED_RENDERING_TEST_ITERATION_CUBEMAP;
  this->m_tests[0].n_layers = 4;
  this->m_tests[0].fs_parts = twodimensionala_fs_parts;
  this->m_tests[0].gs_parts = twodimensionala_gs_parts;
  this->m_tests[0].vs_parts = twodimensionala_vs_parts;
  this->m_tests[0].n_fs_parts = 1;
  this->m_tests[0].n_gs_parts = 3;
  this->m_tests[0].n_vs_parts = 1;
  this->m_tests[0].iteration = LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY;
  this->m_tests[2].n_layers = 4;
  this->m_tests[2].fs_parts = threedimensional_fs_parts;
  this->m_tests[2].gs_parts = threedimensional_gs_parts;
  this->m_tests[2].vs_parts = threedimensional_vs_parts;
  this->m_tests[2].n_fs_parts = 1;
  this->m_tests[2].n_gs_parts = 3;
  this->m_tests[2].n_vs_parts = 1;
  this->m_tests[2].iteration = LAYERED_RENDERING_TEST_ITERATION_3D;
  this->m_tests[1].n_layers = 4;
  this->m_tests[1].fs_parts = twodimensionalma_fs_parts;
  this->m_tests[1].gs_parts = twodimensionalma_gs_parts;
  this->m_tests[1].vs_parts = twodimensionalma_vs_parts;
  this->m_tests[1].n_fs_parts = 1;
  this->m_tests[1].n_gs_parts = 3;
  this->m_tests[1].n_vs_parts = 1;
  this->m_tests[1].iteration = LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY;
  GVar6 = (**(code **)(lVar12 + 0x3f0))(0x8b30);
  this->m_tests[3].fs_id = GVar6;
  GVar6 = (**(code **)(lVar12 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
  this->m_tests[3].gs_id = GVar6;
  GVar6 = (**(code **)(lVar12 + 0x3f0))(0x8b31);
  this->m_tests[3].vs_id = GVar6;
  GVar6 = (**(code **)(lVar12 + 0x3f0))(0x8b30);
  this->m_tests[0].fs_id = GVar6;
  GVar6 = (**(code **)(lVar12 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
  this->m_tests[0].gs_id = GVar6;
  GVar6 = (**(code **)(lVar12 + 0x3f0))(0x8b31);
  this->m_tests[0].vs_id = GVar6;
  GVar6 = (**(code **)(lVar12 + 0x3f0))(0x8b30);
  this->m_tests[2].fs_id = GVar6;
  GVar6 = (**(code **)(lVar12 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
  this->m_tests[2].gs_id = GVar6;
  GVar6 = (**(code **)(lVar12 + 0x3f0))(0x8b31);
  this->m_tests[2].vs_id = GVar6;
  GVar6 = (**(code **)(lVar12 + 0x3f0))(0x8b30);
  this->m_tests[1].fs_id = GVar6;
  GVar6 = (**(code **)(lVar12 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
  this->m_tests[1].gs_id = GVar6;
  GVar6 = (**(code **)(lVar12 + 0x3f0))(0x8b31);
  this->m_tests[1].vs_id = GVar6;
  dVar7 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar7,"Could not create shaders!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                  ,0x137);
  GVar6 = (**(code **)(lVar12 + 0x3c8))();
  this->m_tests[3].po_id = GVar6;
  GVar6 = (**(code **)(lVar12 + 0x3c8))();
  this->m_tests[0].po_id = GVar6;
  GVar6 = (**(code **)(lVar12 + 0x3c8))();
  this->m_tests[2].po_id = GVar6;
  GVar6 = (**(code **)(lVar12 + 0x3c8))();
  this->m_tests[1].po_id = GVar6;
  dVar7 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar7,"Could not create programs!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                  ,0x140);
  bVar4 = buildProgramForLRTest(this,p_Var11);
  if (bVar4) {
    local_1288 = this->m_tests;
    bVar4 = buildProgramForLRTest(this,local_1288);
    if (!bVar4) goto LAB_00ce2671;
    p_Var2 = this->m_tests + 2;
    bVar4 = buildProgramForLRTest(this,p_Var2);
    if (!bVar4) goto LAB_00ce2671;
    p_Var1 = this->m_tests + 1;
    bVar4 = buildProgramForLRTest(this,p_Var1);
    if (!bVar4) goto LAB_00ce2671;
    layer_provoking_vertex_gl_value = -1;
    (**(code **)(lVar12 + 0x868))
              ((this->super_TestCaseBase).m_glExtTokens.LAYER_PROVOKING_VERTEX,
               &layer_provoking_vertex_gl_value);
    dVar7 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar7,"glGetIntegerv() failed for GL_LAYER_PROVOKING_VERTEX_EXT pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                    ,0x150);
    local_12b0 = p_Var11;
    local_12a8 = this;
    local_12a0 = p_Var1;
    local_1298 = p_Var2;
    if (layer_provoking_vertex_gl_value ==
        (this->super_TestCaseBase).m_glExtTokens.FIRST_VERTEX_CONVENTION) {
      uVar19 = 1;
LAB_00ce1de1:
      local_1290 = lVar12;
      for (lVar14 = 0; pGVar17 = local_12a8, lVar14 != 0x120; lVar14 = lVar14 + 0x48) {
        uVar8 = (**(code **)(lVar12 + 0xb48))
                          (*(undefined4 *)((long)&this->m_tests[0].po_id + lVar14),
                           "provoking_vertex_index");
        dVar7 = (**(code **)(local_1290 + 0x800))();
        glu::checkError(dVar7,"glGetUniformLocation() call generated an error",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                        ,0x169);
        lVar12 = local_1290;
        (**(code **)(local_1290 + 0x1080))
                  (*(undefined4 *)((long)&this->m_tests[0].po_id + lVar14),uVar8,uVar19);
        dVar7 = (**(code **)(lVar12 + 0x800))();
        glu::checkError(dVar7,"glProgramUniform1i() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                        ,0x170);
      }
      (**(code **)(lVar12 + 0x6f8))(1,&local_12a8->m_tests[3].to_id);
      (**(code **)(lVar12 + 0x6f8))(1,&pGVar17->m_tests[0].to_id);
      (**(code **)(lVar12 + 0x6f8))(1,&pGVar17->m_tests[2].to_id);
      (**(code **)(lVar12 + 0x6f8))(1,&pGVar17->m_tests[1].to_id);
      dVar7 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar7,"Could not create texture object(s)!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                      ,0x179);
      (**(code **)(lVar12 + 0xb8))(0x8513,pGVar17->m_tests[3].to_id);
      (**(code **)(lVar12 + 0x1380))(0x8513,1,0x8058,0x20,0x20);
      (**(code **)(lVar12 + 0xb8))(0x8c1a,pGVar17->m_tests[0].to_id);
      (**(code **)(lVar12 + 0x1398))(0x8c1a,1,0x8058,0x20,0x20,0x40);
      (**(code **)(lVar12 + 0xb8))(0x806f,pGVar17->m_tests[2].to_id);
      (**(code **)(lVar12 + 0x1398))(0x806f,1,0x8058,0x20,0x20,0x40);
      (**(code **)(lVar12 + 0xb8))(0x9102,pGVar17->m_tests[1].to_id);
      (**(code **)(lVar12 + 0x13a8))(0x9102,1,0x8058,0x20,0x20,0x40,0);
      dVar7 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar7,"Could not initialize texture object(s)!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                      ,0x189);
      (**(code **)(lVar12 + 0x6d0))(1,local_12b0);
      (**(code **)(lVar12 + 0x6d0))(1,local_1288);
      (**(code **)(lVar12 + 0x6d0))(1,local_1298);
      (**(code **)(lVar12 + 0x6d0))(1,local_12a0);
      dVar7 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar7,"Could not create framebuffer object(s)!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                      ,0x191);
      (**(code **)(lVar12 + 0x78))(0x8ca9,pGVar17->m_tests[3].fbo_id);
      p_Var11 = (_layered_rendering_test *)0x0;
      (**(code **)(lVar12 + 0x690))(0x8ca9,0x8ce0,pGVar17->m_tests[3].to_id,0);
      (**(code **)(lVar12 + 0x78))(0x8ca9,pGVar17->m_tests[0].fbo_id);
      (**(code **)(lVar12 + 0x690))(0x8ca9,0x8ce0,pGVar17->m_tests[0].to_id,0);
      (**(code **)(lVar12 + 0x78))(0x8ca9,pGVar17->m_tests[2].fbo_id);
      (**(code **)(lVar12 + 0x690))(0x8ca9,0x8ce0,pGVar17->m_tests[2].to_id,0);
      (**(code **)(lVar12 + 0x78))(0x8ca9,pGVar17->m_tests[1].fbo_id);
      (**(code **)(lVar12 + 0x690))(0x8ca9,0x8ce0,pGVar17->m_tests[1].to_id,0);
      dVar7 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar7,"Could not configure framebuffer object(s)!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                      ,0x1a3);
      (**(code **)(lVar12 + 0x708))(1,&pGVar17->m_vao_id);
      (**(code **)(lVar12 + 0xd8))(pGVar17->m_vao_id);
      dVar7 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar7,"Could not bind a vertex array object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                      ,0x1ab);
      do {
        if (p_Var11 == (_layered_rendering_test *)&DAT_00000004) {
          this_01 = (pGVar17->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
          description = "Pass";
          testResult = QP_TEST_RESULT_PASS;
LAB_00ce2649:
          tcu::TestContext::setTestResult(this_01,testResult,description);
          return STOP;
        }
        memset(buffer,0,0x1000);
        p_Var1 = local_1288;
        p_Var2 = local_1288 + (long)p_Var11;
        local_12a0 = p_Var11;
        (**(code **)(lVar12 + 0x78))(0x8d40,local_1288[(long)p_Var11].fbo_id);
        GVar6 = p_Var1[(long)p_Var11].po_id;
        local_12b0 = (_layered_rendering_test *)
                     CONCAT44(local_12b0._4_4_,p_Var1[(long)p_Var11].to_id);
        (**(code **)(lVar12 + 0x1c0))(0x3f800000,0x3f800000,0x3f800000,0x3f800000);
        (**(code **)(lVar12 + 0x188))(0x4000);
        (**(code **)(lVar12 + 0x1680))(GVar6);
        (**(code **)(lVar12 + 0x538))(0,0,1);
        dVar7 = (**(code **)(lVar12 + 0x800))();
        glu::checkError(dVar7,"Error rendering geometry!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                        ,0x1c6);
        local_1298 = p_Var2;
        for (uVar15 = 0; p_Var11 = local_1298, uVar15 < local_1298->n_layers; uVar15 = uVar15 + 1) {
          if (local_1298->iteration < LAYERED_RENDERING_TEST_ITERATION_CUBEMAP) {
            (**(code **)(lVar12 + 0x6b8))
                      (0x8ca8,0x8ce0,(ulong)local_12b0 & 0xffffffff,0,uVar15 & 0xffffffff);
          }
          else {
            if (local_1298->iteration != LAYERED_RENDERING_TEST_ITERATION_CUBEMAP) {
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,"This location should never be reached",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                         ,0x1fd);
              goto LAB_00ce269a;
            }
            iVar5 = (int)uVar15 + 0x8515;
            if (3 < uVar15) {
              iVar5 = (uVar15 != 4) + 0x8519;
            }
            (**(code **)(lVar12 + 0x6a0))(0x8ca8,0x8ce0,iVar5,(ulong)local_12b0 & 0xffffffff,0);
          }
          dVar7 = (**(code **)(lVar12 + 0x800))();
          glu::checkError(dVar7,"Error setting read framebuffer!",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                          ,0x21c);
          if (p_Var11->iteration == LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY) {
            _new_dst_to = (TestLog *)((ulong)_new_dst_to & 0xffffffff00000000);
            dst_fbo_id = 0;
            (**(code **)(lVar12 + 0x6d0))(1,&dst_fbo_id);
            (**(code **)(lVar12 + 0x78))(0x8ca8,p_Var11->fbo_id);
            (**(code **)(lVar12 + 0x78))(0x8ca9,dst_fbo_id);
            (**(code **)(lVar12 + 0x6f8))(1,&new_dst_to);
            (**(code **)(lVar12 + 0xb8))(0xde1,(ulong)_new_dst_to & 0xffffffff);
            (**(code **)(lVar12 + 0x1380))(0xde1,1,0x8058,0x20,0x20);
            dVar7 = (**(code **)(lVar12 + 0x800))();
            glu::checkError(dVar7,
                            "Could not setup texture object for draw framebuffer color attachment.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                            ,0x22e);
            (**(code **)(lVar12 + 0x6a0))(0x8ca9,0x8ce0,0xde1,(ulong)_new_dst_to & 0xffffffff,0);
            dVar7 = (**(code **)(lVar12 + 0x800))();
            glu::checkError(dVar7,
                            "Could not attach texture object to draw framebuffer color attachment.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                            ,0x233);
            (**(code **)(lVar12 + 0x140))(0,0,0x20,0x20,0,0,0x20,0x20,0x4000,0x2601);
            dVar7 = (**(code **)(lVar12 + 0x800))();
            glu::checkError(dVar7,"Error blitting from read framebuffer to draw framebuffer.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                            ,0x238);
            (**(code **)(lVar12 + 0x78))(0x8ca8,dst_fbo_id);
            (**(code **)(lVar12 + 0x1220))(0,0,0x20,0x20,0x1908,0x1401,buffer);
            dVar7 = (**(code **)(lVar12 + 0x800))();
            glu::checkError(dVar7,"Error reading attachment\'s data!",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                            ,0x23e);
            (**(code **)(lVar12 + 0x78))(0x8d40,p_Var11->fbo_id);
            (**(code **)(lVar12 + 0x440))(1,&dst_fbo_id);
            (**(code **)(lVar12 + 0x480))(1);
          }
          else {
            (**(code **)(lVar12 + 0x1220))(0,0,0x20,0x20,0x1908,0x1401,buffer);
            dVar7 = (**(code **)(lVar12 + 0x800))();
            glu::checkError(dVar7,"Error reading attachment\'s data!",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                            ,0x249);
          }
          pGVar17 = local_12a8;
          lVar12 = 4;
          lVar14 = 3;
          lVar18 = 2;
          lVar16 = 1;
          lVar10 = 0;
          while (lVar10 != 0x400) {
            lVar16 = lVar16 + -4;
            lVar18 = lVar18 + -4;
            lVar14 = lVar14 + -4;
            lVar12 = lVar12 + -4;
            lVar3 = lVar10 * 4;
            lVar10 = lVar10 + 1;
            if (*(int *)(buffer + lVar3) !=
                *(int *)((long)&m_layered_rendering_expected_layer_data +
                        (ulong)(uint)((int)uVar15 * 4))) {
              _new_dst_to = ((local_12a8->super_TestCaseBase).super_TestCase.super_TestNode.
                            m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream(local_11b0);
              std::operator<<((ostream *)local_11b0,"Rendered data [");
              pMVar9 = tcu::MessageBuilder::operator<<
                                 ((MessageBuilder *)&new_dst_to,buffer + -lVar12);
              std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", ");
              pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,buffer + -lVar14);
              std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", ");
              pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,buffer + -lVar18);
              std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", ");
              pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,buffer + -lVar16);
              std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              "] is different from reference data [");
              pMVar9 = tcu::MessageBuilder::operator<<
                                 (pMVar9,(uchar *)&m_layered_rendering_expected_layer_data);
              std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", ");
              pMVar9 = tcu::MessageBuilder::operator<<
                                 (pMVar9,(uchar *)((long)&m_layered_rendering_expected_layer_data +
                                                  1));
              std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", ");
              pMVar9 = tcu::MessageBuilder::operator<<
                                 (pMVar9,(uchar *)((long)&m_layered_rendering_expected_layer_data +
                                                  2));
              std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", ");
              pMVar9 = tcu::MessageBuilder::operator<<
                                 (pMVar9,(uchar *)((long)&m_layered_rendering_expected_layer_data +
                                                  3));
              std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              "] !");
              tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(local_11b0);
              this_01 = (pGVar17->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
              description = "Fail";
              testResult = QP_TEST_RESULT_FAIL;
              goto LAB_00ce2649;
            }
          }
          lVar12 = local_1290;
        }
        p_Var11 = (_layered_rendering_test *)((long)&local_12a0->fbo_id + 1);
        pGVar17 = local_12a8;
      } while( true );
    }
    if (layer_provoking_vertex_gl_value ==
        (this->super_TestCaseBase).m_glExtTokens.LAST_VERTEX_CONVENTION) {
      uVar19 = 2;
      goto LAB_00ce1de1;
    }
    uVar19 = 0;
    if (layer_provoking_vertex_gl_value == (this->super_TestCaseBase).m_glExtTokens.UNDEFINED_VERTEX
       ) goto LAB_00ce1de1;
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,
               "Unrecognized value returned by glGetIntegerv() for GL_LAYER_PROVOKING_VERTEX_EXT pname."
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
               ,0x160);
  }
  else {
LAB_00ce2671:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Could not create a program for cube-map texture layered rendering test!",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
               ,0x148);
  }
LAB_00ce269a:
  ppuVar13 = &tcu::TestError::typeinfo;
LAB_00ce26a1:
  __cxa_throw(this_00,ppuVar13,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderLayeredRendering::iterate(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Helper variables to support shader compilation process */
	const char* cm_fs_parts[] = { m_layered_rendering_fs_code };
	const char* cm_gs_parts[] = { m_layered_rendering_gs_code_preamble, m_layered_rendering_gs_code_cm,
								  m_layered_rendering_gs_code_main };
	const char* cm_vs_parts[]				= { m_layered_rendering_vs_code };
	const char* threedimensional_fs_parts[] = { m_layered_rendering_fs_code };
	const char* threedimensional_gs_parts[] = { m_layered_rendering_gs_code_preamble, m_layered_rendering_gs_code_3d,
												m_layered_rendering_gs_code_main };
	const char* threedimensional_vs_parts[] = { m_layered_rendering_vs_code };
	const char* twodimensionala_fs_parts[]  = { m_layered_rendering_fs_code };
	const char* twodimensionala_gs_parts[]  = { m_layered_rendering_gs_code_preamble,
											   m_layered_rendering_gs_code_2d_array, m_layered_rendering_gs_code_main };
	const char* twodimensionala_vs_parts[]  = { m_layered_rendering_vs_code };
	const char* twodimensionalma_fs_parts[] = { m_layered_rendering_fs_code };
	const char* twodimensionalma_gs_parts[] = { m_layered_rendering_gs_code_preamble,
												m_layered_rendering_gs_code_2d_marray,
												m_layered_rendering_gs_code_main };
	const char*		   twodimensionalma_vs_parts[] = { m_layered_rendering_vs_code };
	const unsigned int n_cm_fs_parts			   = sizeof(cm_fs_parts) / sizeof(cm_fs_parts[0]);
	const unsigned int n_cm_gs_parts			   = sizeof(cm_gs_parts) / sizeof(cm_gs_parts[0]);
	const unsigned int n_cm_vs_parts			   = sizeof(cm_vs_parts) / sizeof(cm_vs_parts[0]);
	const unsigned int n_threedimensional_fs_parts =
		sizeof(threedimensional_fs_parts) / sizeof(threedimensional_fs_parts[0]);
	const unsigned int n_threedimensional_gs_parts =
		sizeof(threedimensional_gs_parts) / sizeof(threedimensional_gs_parts[0]);
	const unsigned int n_threedimensional_vs_parts =
		sizeof(threedimensional_vs_parts) / sizeof(threedimensional_vs_parts[0]);
	const unsigned int n_twodimensionala_fs_parts =
		sizeof(twodimensionala_fs_parts) / sizeof(twodimensionala_fs_parts[0]);
	const unsigned int n_twodimensionala_gs_parts =
		sizeof(twodimensionala_gs_parts) / sizeof(twodimensionala_gs_parts[0]);
	const unsigned int n_twodimensionala_vs_parts =
		sizeof(twodimensionala_vs_parts) / sizeof(twodimensionala_vs_parts[0]);
	const unsigned int n_twodimensionalma_fs_parts =
		sizeof(twodimensionalma_fs_parts) / sizeof(twodimensionalma_fs_parts[0]);
	const unsigned int n_twodimensionalma_gs_parts =
		sizeof(twodimensionalma_gs_parts) / sizeof(twodimensionalma_gs_parts[0]);
	const unsigned int n_twodimensionalma_vs_parts =
		sizeof(twodimensionalma_vs_parts) / sizeof(twodimensionalma_vs_parts[0]);

	/* General-use helper variables */
	unsigned int n_current_test = 0;

	/* This test should only run if EXT_geometry_shader is supported */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Configure test descriptors */
	m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].iteration  = LAYERED_RENDERING_TEST_ITERATION_CUBEMAP;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].n_layers   = 6; /* faces */
	m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].fs_parts   = cm_fs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].gs_parts   = cm_gs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].vs_parts   = cm_vs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].n_fs_parts = n_cm_fs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].n_gs_parts = n_cm_gs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].n_vs_parts = n_cm_vs_parts;

	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].iteration  = LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].n_layers   = 4; /* layers */
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].fs_parts   = twodimensionala_fs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].gs_parts   = twodimensionala_gs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].vs_parts   = twodimensionala_vs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].n_fs_parts = n_twodimensionala_fs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].n_gs_parts = n_twodimensionala_gs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].n_vs_parts = n_twodimensionala_vs_parts;

	m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].iteration  = LAYERED_RENDERING_TEST_ITERATION_3D;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].n_layers   = 4; /* layers */
	m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].fs_parts   = threedimensional_fs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].gs_parts   = threedimensional_gs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].vs_parts   = threedimensional_vs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].n_fs_parts = n_threedimensional_fs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].n_gs_parts = n_threedimensional_gs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].n_vs_parts = n_threedimensional_vs_parts;

	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].iteration =
		LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].n_layers   = 4; /* layers */
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].fs_parts   = twodimensionalma_fs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].gs_parts   = twodimensionalma_gs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].vs_parts   = twodimensionalma_vs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].n_fs_parts = n_twodimensionalma_fs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].n_gs_parts = n_twodimensionalma_gs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].n_vs_parts = n_twodimensionalma_vs_parts;

	/* Create shader objects we'll use for the test */
	m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].gs_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].vs_id = gl.createShader(GL_VERTEX_SHADER);

	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].gs_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].vs_id = gl.createShader(GL_VERTEX_SHADER);

	m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].gs_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].vs_id = gl.createShader(GL_VERTEX_SHADER);

	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].gs_id =
		gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shaders!");

	/* Create program objects as well */
	m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].po_id  = gl.createProgram();
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].po_id = gl.createProgram();
	m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].po_id		 = gl.createProgram();

	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create programs!");

	/* Build the programs */
	if (!buildProgramForLRTest(&m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP]) ||
		!buildProgramForLRTest(&m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY]) ||
		!buildProgramForLRTest(&m_tests[LAYERED_RENDERING_TEST_ITERATION_3D]) ||
		!buildProgramForLRTest(&m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY]))
	{
		TCU_FAIL("Could not create a program for cube-map texture layered rendering test!");
	}

	/* Set up provoking vertex uniform value, given the GL_LAYER_PROVOKING_VERTEX_EXT value. */
	glw::GLint layer_provoking_vertex_gl_value		= -1;
	glw::GLint layer_provoking_vertex_uniform_value = -1;

	gl.getIntegerv(m_glExtTokens.LAYER_PROVOKING_VERTEX, &layer_provoking_vertex_gl_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_LAYER_PROVOKING_VERTEX_EXT pname");

	if ((glw::GLenum)layer_provoking_vertex_gl_value == m_glExtTokens.FIRST_VERTEX_CONVENTION)
	{
		layer_provoking_vertex_uniform_value = 1; /* as per geometry shader implementation */
	}
	else if ((glw::GLenum)layer_provoking_vertex_gl_value == m_glExtTokens.LAST_VERTEX_CONVENTION)
	{
		layer_provoking_vertex_uniform_value = 2; /* as per geometry shader implementation */
	}
	else if ((glw::GLenum)layer_provoking_vertex_gl_value == m_glExtTokens.UNDEFINED_VERTEX)
	{
		layer_provoking_vertex_uniform_value = 0; /* as per geometry shader implementation */
	}
	else
	{
		TCU_FAIL("Unrecognized value returned by glGetIntegerv() for GL_LAYER_PROVOKING_VERTEX_EXT pname.");
	}

	for (unsigned int test_index = 0; test_index < LAYERED_RENDERING_TEST_ITERATION_LAST; ++test_index)
	{
		glw::GLint provoking_vertex_index_uniform_location =
			gl.getUniformLocation(m_tests[test_index].po_id, "provoking_vertex_index");

		/* Sanity checks */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformLocation() call generated an error");
		DE_ASSERT(provoking_vertex_index_uniform_location != -1);

		/* Assign the uniform value */
		gl.programUniform1i(m_tests[test_index].po_id, provoking_vertex_index_uniform_location,
							layer_provoking_vertex_uniform_value);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glProgramUniform1i() call failed.");
	} /* for (all test iterations) */

	/* Initialize texture objects */
	gl.genTextures(1, &m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].to_id);
	gl.genTextures(1, &m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].to_id);
	gl.genTextures(1, &m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].to_id);
	gl.genTextures(1, &m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].to_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create texture object(s)!");

	gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].to_id);
	gl.texStorage2D(GL_TEXTURE_CUBE_MAP, 1 /* mip-map only */, GL_RGBA8, TEXTURE_WIDTH, TEXTURE_HEIGHT);

	gl.bindTexture(GL_TEXTURE_2D_ARRAY, m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].to_id);
	gl.texStorage3D(GL_TEXTURE_2D_ARRAY, 1 /* mip-map only */, GL_RGBA8, TEXTURE_WIDTH, TEXTURE_HEIGHT, TEXTURE_DEPTH);

	gl.bindTexture(GL_TEXTURE_3D, m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].to_id);
	gl.texStorage3D(GL_TEXTURE_3D, 1 /* mip-map only */, GL_RGBA8, TEXTURE_WIDTH, TEXTURE_HEIGHT, TEXTURE_DEPTH);

	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES,
				   m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].to_id);
	gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 1 /* samples */, GL_RGBA8, TEXTURE_WIDTH,
							   TEXTURE_HEIGHT, TEXTURE_DEPTH, GL_FALSE /* fixed sample locations */);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not initialize texture object(s)!");

	/* Initialize framebuffer objects */
	gl.genFramebuffers(1, &m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].fbo_id);
	gl.genFramebuffers(1, &m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].fbo_id);
	gl.genFramebuffers(1, &m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].fbo_id);
	gl.genFramebuffers(1, &m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].fbo_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create framebuffer object(s)!");

	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].fbo_id);
	gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0,
						  m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].to_id, 0 /* base mip-map */);

	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].fbo_id);
	gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0,
						  m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].to_id, 0 /* base mip-map */);

	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].fbo_id);
	gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].to_id,
						  0 /* base mip-map */);

	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].fbo_id);
	gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0,
						  m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].to_id, 0 /* base mip-map */);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not configure framebuffer object(s)!");

	/* Initialize vertex array object. We don't really use any attributes, but ES does not
	 * permit draw calls with an unbound VAO
	 */
	gl.genVertexArrays(1, &m_vao_id);
	gl.bindVertexArray(m_vao_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind a vertex array object!");

	/* Execute all iterations */
	for (n_current_test = 0; n_current_test < sizeof(m_tests) / sizeof(m_tests[0]); ++n_current_test)
	{
		unsigned char buffer[TEXTURE_WIDTH * TEXTURE_HEIGHT * TEXTURE_N_COMPONENTS] = { 0 };
		glw::GLuint   program_id													= 0;
		unsigned int  n_layer														= 0;
		glw::GLuint   texture_id													= 0;

		/* Bind the iteration-specific framebuffer */
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_tests[n_current_test].fbo_id);

		program_id = m_tests[n_current_test].po_id;
		texture_id = m_tests[n_current_test].to_id;

		/* Clear the color attachment with (1, 1, 1, 1) which is not used for
		 * any layers.
		 */
		gl.clearColor(1.0f, 1.0f, 1.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);

		/* Render a single point. This should result in full-screen quads drawn
		 * for each face/layer of the attachment bound to current FBO */
		gl.useProgram(program_id);
		gl.drawArrays(GL_POINTS, 0 /* first index */, 1 /* n points */);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Error rendering geometry!");

		/* Read contents of each layer we rendered to and verify the contents */
		for (n_layer = 0; n_layer < m_tests[n_current_test].n_layers; ++n_layer)
		{
			const unsigned char* expected_data =
				m_layered_rendering_expected_layer_data + TEXTURE_N_COMPONENTS * n_layer;
			unsigned int n				 = 0;
			bool		 texture_layered = false;
			glw::GLenum  texture_target  = GL_NONE;

			/* What is the source attachment's texture target? */
			switch (m_tests[n_current_test].iteration)
			{
			case LAYERED_RENDERING_TEST_ITERATION_CUBEMAP:
			{
				texture_layered = false;
				texture_target  = (n_layer == 0) ?
									 GL_TEXTURE_CUBE_MAP_POSITIVE_X :
									 (n_layer == 1) ?
									 GL_TEXTURE_CUBE_MAP_NEGATIVE_X :
									 (n_layer == 2) ? GL_TEXTURE_CUBE_MAP_POSITIVE_Y :
													  (n_layer == 3) ? GL_TEXTURE_CUBE_MAP_NEGATIVE_Y :
																	   (n_layer == 4) ? GL_TEXTURE_CUBE_MAP_POSITIVE_Z :
																						GL_TEXTURE_CUBE_MAP_NEGATIVE_Z;

				break;
			}

			case LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY:
			{
				texture_layered = true;
				texture_target  = GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES;

				break;
			}

			case LAYERED_RENDERING_TEST_ITERATION_3D:
			{
				texture_layered = true;
				texture_target  = GL_TEXTURE_3D;

				break;
			}

			case LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY:
			{
				texture_layered = true;
				texture_target  = GL_TEXTURE_2D_ARRAY;

				break;
			}

			default:
			{
				TCU_FAIL("This location should never be reached");
			}
			}

			/* Configure the read framebuffer's read buffer, depending on whether the attachment
			 * uses layers or not
			 */
			if (texture_layered)
			{
				gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, texture_id, 0 /* base mip-map */,
										   n_layer);
			}
			else
			{
				if (texture_target == GL_TEXTURE_CUBE_MAP_POSITIVE_X ||
					texture_target == GL_TEXTURE_CUBE_MAP_POSITIVE_Y ||
					texture_target == GL_TEXTURE_CUBE_MAP_POSITIVE_Z ||
					texture_target == GL_TEXTURE_CUBE_MAP_NEGATIVE_X ||
					texture_target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Y ||
					texture_target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Z)
				{
					gl.framebufferTexture2D(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, texture_target, texture_id,
											0 /* base mip-map */);
				}
				else
				{
					TCU_FAIL("This location should never be reached");
				}
			}

			/* Make sure read framebuffer was configured successfully */
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting read framebuffer!");

			/* Read the data */
			if (m_tests[n_current_test].iteration == LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY)
			{
				glw::GLuint new_dst_to = 0;
				glw::GLuint dst_fbo_id = 0;

				gl.genFramebuffers(1, &dst_fbo_id);

				gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_tests[n_current_test].fbo_id);
				gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, dst_fbo_id);

				gl.genTextures(1, &new_dst_to);
				gl.bindTexture(GL_TEXTURE_2D, new_dst_to);
				gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, TEXTURE_WIDTH, TEXTURE_HEIGHT);

				GLU_EXPECT_NO_ERROR(gl.getError(),
									"Could not setup texture object for draw framebuffer color attachment.");

				gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, new_dst_to, 0);

				GLU_EXPECT_NO_ERROR(gl.getError(),
									"Could not attach texture object to draw framebuffer color attachment.");

				gl.blitFramebuffer(0, 0, TEXTURE_WIDTH, TEXTURE_HEIGHT, 0, 0, TEXTURE_WIDTH, TEXTURE_HEIGHT,
								   GL_COLOR_BUFFER_BIT, GL_LINEAR);

				GLU_EXPECT_NO_ERROR(gl.getError(), "Error blitting from read framebuffer to draw framebuffer.");

				gl.bindFramebuffer(GL_READ_FRAMEBUFFER, dst_fbo_id);

				gl.readPixels(0 /* x */, 0 /* y */, TEXTURE_WIDTH, TEXTURE_HEIGHT, GL_RGBA, GL_UNSIGNED_BYTE, buffer);

				GLU_EXPECT_NO_ERROR(gl.getError(), "Error reading attachment's data!");

				gl.bindFramebuffer(GL_FRAMEBUFFER, m_tests[n_current_test].fbo_id);

				gl.deleteFramebuffers(1, &dst_fbo_id);
				gl.deleteTextures(1, &new_dst_to);
			}
			else
			{
				gl.readPixels(0 /* x */, 0 /* y */, TEXTURE_WIDTH, TEXTURE_HEIGHT, GL_RGBA, GL_UNSIGNED_BYTE, buffer);

				GLU_EXPECT_NO_ERROR(gl.getError(), "Error reading attachment's data!");
			}

			/* Validate it */
			for (; n < TEXTURE_WIDTH * TEXTURE_HEIGHT; ++n)
			{
				unsigned char* data_ptr = buffer + n * TEXTURE_N_COMPONENTS;

				if (memcmp(data_ptr, expected_data, TEXTURE_N_COMPONENTS) != 0)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Rendered data [" << data_ptr[0] << ", "
									   << data_ptr[1] << ", " << data_ptr[2] << ", " << data_ptr[3]
									   << "] is different from reference data ["
									   << m_layered_rendering_expected_layer_data[0] << ", "
									   << m_layered_rendering_expected_layer_data[1] << ", "
									   << m_layered_rendering_expected_layer_data[2] << ", "
									   << m_layered_rendering_expected_layer_data[3] << "] !"
									   << tcu::TestLog::EndMessage;

					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
					return STOP;
				} /* if (data comparison failed) */
			}	 /* for (all pixels) */
		}		  /* for (all layers) */
	}			  /* for (all iterations) */

	/* Done! */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}